

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_9edf7::CleanTestCleanDepFileOnCleanTarget::Run
          (CleanTestCleanDepFileOnCleanTarget *this)

{
  State *state;
  VirtualFileSystem *this_00;
  DyndepLoader *pDVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Test *this_01;
  int iVar3;
  Cleaner cleaner;
  string local_e8;
  Cleaner local_c8;
  
  iVar3 = g_current_test->assertion_failures_;
  state = &(this->super_CleanTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,"rule cc\n  command = cc $in > $out\n  depfile = $out.d\nbuild out1: cc in1\n",
              (ManifestParserOptions)0x0);
  if (iVar3 == g_current_test->assertion_failures_) {
    pDVar1 = &local_c8.dyndep_loader_;
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out1","");
    paVar2 = &local_e8.field_2;
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    this_00 = &(this->super_CleanTest).fs_;
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    local_c8.state_ = (State *)pDVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"out1.d","");
    local_e8._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"");
    VirtualFileSystem::Create(this_00,(string *)&local_c8,&local_e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != paVar2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_c8.state_ != (State *)pDVar1) {
      operator_delete(local_c8.state_,
                      (ulong)((long)&((local_c8.dyndep_loader_.state_)->paths_)._M_h + 1));
    }
    Cleaner::Cleaner(&local_c8,state,&(this->super_CleanTest).config_,&this_00->super_DiskInterface)
    ;
    this_01 = g_current_test;
    iVar3 = Cleaner::CleanTarget(&local_c8,"out1");
    testing::Test::Check
              (this_01,iVar3 == 0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x117,"0 == cleaner.CleanTarget(\"out1\")");
    testing::Test::Check
              (g_current_test,local_c8.cleaned_files_count_ == 2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x118,"2 == cleaner.cleaned_files_count()");
    testing::Test::Check
              (g_current_test,
               (this->super_CleanTest).fs_.files_removed_._M_t._M_impl.super__Rb_tree_header.
               _M_node_count == 2,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/clean_test.cc"
               ,0x119,"2u == fs_.files_removed_.size()");
    std::
    _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>::
    ~_Rb_tree(&local_c8.cleaned_._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_c8.removed_._M_t);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(CleanTest, CleanDepFileOnCleanTarget) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule cc\n"
"  command = cc $in > $out\n"
"  depfile = $out.d\n"
"build out1: cc in1\n"));
  fs_.Create("out1", "");
  fs_.Create("out1.d", "");

  Cleaner cleaner(&state_, config_, &fs_);
  EXPECT_EQ(0, cleaner.CleanTarget("out1"));
  EXPECT_EQ(2, cleaner.cleaned_files_count());
  EXPECT_EQ(2u, fs_.files_removed_.size());
}